

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

double __thiscall Matrix::getMaxValue(Matrix *this)

{
  int local_1c;
  double dStack_18;
  int i;
  double result;
  Matrix *this_local;
  
  dStack_18 = *this->pData;
  for (local_1c = 0; local_1c < this->nData; local_1c = local_1c + 1) {
    if (dStack_18 < this->pData[local_1c]) {
      dStack_18 = this->pData[local_1c];
    }
  }
  return dStack_18;
}

Assistant:

double Matrix::getMaxValue()
{
	double result = pData[0];
	
	for(int i=0; i<nData; i++)
		if (pData[i] > result)
			result = pData[i];

	return result;
}